

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O1

void __thiscall
helics::apps::App::App
          (App *this,string_view defaultAppName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  FederateInfo fedInfo;
  undefined1 local_1f0 [448];
  
  this->_vptr_App = (_func_int **)&PTR__App_00522dd8;
  (this->fed).super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->fed).super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->stopTime).internalTimeCode = 0x7fffffffffffffff;
  local_1f0._16_8_ = &(this->configFileName).field_2;
  (this->configFileName)._M_dataplus._M_p = (pointer)local_1f0._16_8_;
  (this->configFileName)._M_string_length = 0;
  (this->configFileName).field_2._M_local_buf[0] = '\0';
  local_1f0._8_8_ = &(this->inputFileName).field_2;
  (this->inputFileName)._M_dataplus._M_p = (pointer)local_1f0._8_8_;
  (this->inputFileName)._M_string_length = 0;
  (this->inputFileName).field_2._M_local_buf[0] = '\0';
  (this->outFileName)._M_dataplus._M_p = (pointer)&(this->outFileName).field_2;
  (this->outFileName)._M_string_length = 0;
  (this->outFileName).field_2._M_local_buf[0] = '\0';
  (this->remArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->remArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->remArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->helpMode = false;
  this->useLocal = false;
  this->fileLoaded = false;
  this->deactivated = false;
  this->quietMode = false;
  generateParser((App *)local_1f0);
  FederateInfo::FederateInfo((FederateInfo *)(local_1f0 + 0x18));
  FederateInfo::injectParser((FederateInfo *)(local_1f0 + 0x18),(App *)local_1f0._0_8_);
  helicsCLI11App::
  helics_parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((helicsCLI11App *)local_1f0._0_8_,args);
  processArgs(this,(unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                    *)local_1f0,(FederateInfo *)(local_1f0 + 0x18),defaultAppName);
  FederateInfo::~FederateInfo((FederateInfo *)(local_1f0 + 0x18));
  if ((__uniq_ptr_impl<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>)
      local_1f0._0_8_ !=
      (__uniq_ptr_impl<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>)0x0) {
    (**(code **)(*(long *)local_1f0._0_8_ + 8))();
  }
  return;
}

Assistant:

App::App(std::string_view defaultAppName, std::vector<std::string> args)
{
    auto app = generateParser();
    FederateInfo fedInfo;
    fedInfo.injectParser(app.get());
    app->helics_parse(std::move(args));
    processArgs(app, fedInfo, defaultAppName);
}